

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_impl.cpp
# Opt level: O1

void __thiscall gamespace::GameScreenImpl::createContextForLookAt(GameScreenImpl *this)

{
  BoardTile *pBVar1;
  Unit *pUVar2;
  UI *pUVar3;
  pointer plVar4;
  long lVar5;
  CoordinateMenu *this_00;
  Context *pCVar6;
  dvec2 mp;
  int iVar7;
  UI *dui;
  layer_t *c;
  pointer plVar8;
  bool bVar9;
  bool bVar10;
  dvec2 r;
  undefined8 local_68;
  long *local_50;
  double local_48;
  long local_40 [2];
  
  pBVar1 = (this->_selection).hovering;
  if ((pBVar1 != (BoardTile *)0x0) && (pUVar2 = pBVar1->_unit, pUVar2 != (Unit *)0x0)) {
    pUVar3 = (this->_ui)._M_t.super___uniq_ptr_impl<ui::UI,_std::default_delete<ui::UI>_>._M_t.
             super__Tuple_impl<0UL,_ui::UI_*,_std::default_delete<ui::UI>_>.
             super__Head_base<0UL,_ui::UI_*,_false>._M_head_impl;
    plVar8 = *(pointer *)
              &(pUVar3->_layers).super__Vector_base<ui::layer_t,_std::allocator<ui::layer_t>_>;
    plVar4 = *(pointer *)
              ((long)&(pUVar3->_layers).
                      super__Vector_base<ui::layer_t,_std::allocator<ui::layer_t>_> + 8);
    bVar9 = plVar8 != plVar4;
    if (bVar9) {
      bVar9 = true;
      do {
        lVar5 = *(long *)&(plVar8->name)._M_dataplus;
        local_50 = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_50,lVar5,(plVar8->name)._M_string_length + lVar5);
        lVar5 = *(long *)((long)(plVar8->layer)._M_t.
                                super___uniq_ptr_impl<ui::Renderable,_std::default_delete<ui::Renderable>_>
                         + 0x90);
        iVar7 = std::__cxx11::string::compare((char *)&local_50);
        if (iVar7 == 0) {
          bVar10 = *(Unit **)(lVar5 + 0x50) == pUVar2;
        }
        else {
          bVar10 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (bVar10) break;
        plVar8 = plVar8 + 1;
        bVar9 = plVar8 != plVar4;
      } while (bVar9);
    }
    if (!bVar9) {
      this_00 = (CoordinateMenu *)(this->_selection).hovering;
      pCVar6 = this->_ctxt;
      pBVar1 = (BoardTile *)
               (this->_ui)._M_t.super___uniq_ptr_impl<ui::UI,_std::default_delete<ui::UI>_>._M_t.
               super__Tuple_impl<0UL,_ui::UI_*,_std::default_delete<ui::UI>_>.
               super__Head_base<0UL,_ui::UI_*,_false>._M_head_impl;
      local_68._4_4_ = (float)pCVar6->_h;
      local_68._0_4_ = (float)pCVar6->_w;
      glfwGetCursorPos(pCVar6->_window,(double *)&local_50,&local_48);
      mp.field_0.field_0.y = local_48;
      mp.field_0.field_0.x = (double)local_50;
      CoordinateMenu::createForTile(this_00,pBVar1,dui,local_68,mp);
    }
  }
  return;
}

Assistant:

void GameScreenImpl::createContextForLookAt() {
    if(_selection.hovering == nullptr) return;
    auto *u = _selection.hovering->unit();
    if(u && _ui->hasModelMatching([u](std::string name, void *m){return name == "unitctxt" && ((CoordinateMenu*)m)->unit() == u;}) == false)
        CoordinateMenu::createForTile(_selection.hovering, _ui.get(), _ctxt->getResolution(), _ctxt->getMousePos());
}